

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoCreateGateMaches
               (Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,int **pComp,int **pPerm,
               int *pnPerms,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,int fPinPerm,
               int fPinQuick)

{
  uint uVar1;
  uint uVar2;
  word wVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uTruth;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int Perm [6];
  
  uVar1 = *(uint *)&pCell->field_0x10;
  if (0x6fffffff < uVar1) {
    __assert_fail("pCell->nFanins <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0xff,
                  "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  uVar2 = pnPerms[uVar1 >> 0x1c];
  uVar8 = uVar1;
  for (uVar7 = 0; uVar7 < uVar8 >> 0x1c; uVar7 = uVar7 + 1) {
    iVar4 = Abc_Var2Lit((int)uVar7,0);
    Perm[uVar7] = iVar4;
    uVar8 = *(uint *)&pCell->field_0x10;
  }
  wVar3 = pCell->uTruth;
  uVar9 = 0;
  uVar6 = 0;
  uVar7 = wVar3;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  while( true ) {
    if (uVar9 == uVar6) {
      if (wVar3 != uVar7) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x117,
                      "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      return;
    }
    uTruth = uVar7;
    for (lVar10 = 0; (uint)lVar10 >> (byte)(uVar1 >> 0x1c) == 0; lVar10 = lVar10 + 1) {
      Nf_StoCreateGateAdd(vTtMem,vTt2Match,pCell,uTruth,Perm,uVar8 >> 0x1c,vProfs,vStore,fPinFilter,
                          fPinPerm,fPinQuick);
      uVar8 = *(uint *)&pCell->field_0x10;
      iVar4 = pComp[uVar8 >> 0x1c][lVar10];
      if (Perm[iVar4] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      bVar5 = (byte)(1 << ((byte)iVar4 & 0x1f));
      uTruth = uTruth << (bVar5 & 0x3f) & s_Truths6[iVar4] |
               (s_Truths6[iVar4] & uTruth) >> (bVar5 & 0x3f);
      Perm[iVar4] = Perm[iVar4] ^ 1;
    }
    if (uVar7 != uTruth) break;
    if (uVar2 != 1) {
      iVar4 = pPerm[uVar8 >> 0x1c][uVar9];
      bVar5 = (byte)(1L << ((byte)iVar4 & 0x3f));
      uVar7 = (uVar7 & s_PMasks[iVar4][2]) >> (bVar5 & 0x3f) |
              (s_PMasks[iVar4][1] & uVar7) << (bVar5 & 0x3f) | s_PMasks[iVar4][0] & uVar7;
      *(ulong *)(Perm + iVar4) =
           CONCAT44((int)*(undefined8 *)(Perm + iVar4),
                    (int)((ulong)*(undefined8 *)(Perm + iVar4) >> 0x20));
    }
    uVar9 = uVar9 + 1;
  }
  __assert_fail("tTemp2 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x10e,
                "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
               );
}

Assistant:

void Nf_StoCreateGateMaches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, int ** pComp, int ** pPerm, int * pnPerms, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    int Perm[NF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    assert( pCell->nFanins <= 6 );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Nf_StoCreateGateAdd( vTtMem, vTt2Match, pCell, tCur, Perm, pCell->nFanins, vProfs, vStore, fPinFilter, fPinPerm, fPinQuick );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        if ( nPerms == 1 )
            continue;
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}